

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseReturnStmt(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [24];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_50;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> value;
  Token keyword;
  Parser *this_local;
  
  Token::Token((Token *)&value,&in_RSI->m_previous);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<std::default_delete<enact::Expr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)&local_50);
  bVar1 = check(in_RSI,SEMICOLON);
  if (bVar1) {
    std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_68);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)&local_50,
               (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_68);
    std::unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>::~unique_ptr
              ((unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_68);
  }
  else {
    parseExpr((Parser *)local_70);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator=
              (&local_50,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_70);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_70);
  }
  std::
  make_unique<enact::ReturnStmt,enact::Token&,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
            ((Token *)local_78,&value);
  std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
  unique_ptr<enact::ReturnStmt,std::default_delete<enact::ReturnStmt>,void>
            ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
             (unique_ptr<enact::ReturnStmt,_std::default_delete<enact::ReturnStmt>_> *)local_78);
  std::unique_ptr<enact::ReturnStmt,_std::default_delete<enact::ReturnStmt>_>::~unique_ptr
            ((unique_ptr<enact::ReturnStmt,_std::default_delete<enact::ReturnStmt>_> *)local_78);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&local_50);
  Token::~Token((Token *)&value);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseReturnStmt() {
        Token keyword = m_previous;
        std::unique_ptr<Expr> value;
        if (check(TokenType::SEMICOLON)) {
            value = std::make_unique<UnitExpr>(m_current);
        } else {
            value = parseExpr();
        }

        return std::make_unique<ReturnStmt>(keyword, std::move(value));
    }